

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O1

void __thiscall
QStyledItemDelegate::initStyleOption
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  long lVar1;
  undefined4 uVar2;
  long lVar3;
  QAbstractItemModel *pQVar4;
  QMetaTypeInterface *pQVar5;
  InterfaceType *pIVar6;
  QIconPrivate *pQVar7;
  char16_t *pcVar8;
  undefined1 *puVar9;
  undefined8 uVar10;
  quintptr qVar11;
  undefined8 uVar12;
  QMetaType QVar13;
  QMetaType QVar14;
  QIcon QVar15;
  char cVar16;
  bool bVar17;
  QFlags<Qt::AlignmentFlag> QVar18;
  CheckState CVar19;
  int iVar20;
  ulong uVar21;
  QMetaType QVar22;
  ulong uVar23;
  State SVar24;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  QPixmap *this_00;
  QBrush *pQVar28;
  QFont *pQVar29;
  long in_FS_OFFSET;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar34 [16];
  QIcon moved_3;
  QFont t;
  QIcon moved_1;
  QIcon local_88;
  QIcon local_80;
  QIcon local_78;
  undefined4 uStack_70;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (option->index).m.ptr = (index->m).ptr;
  iVar20 = index->c;
  qVar11 = index->i;
  (option->index).r = index->r;
  (option->index).c = iVar20;
  (option->index).i = qVar11;
  lVar3 = *(long *)(this + 8);
  pQVar4 = (index->m).ptr;
  if (pQVar4 != (QAbstractItemModel *)0x0) {
    (**(code **)(*(long *)pQVar4 + 0x168))(pQVar4,index,lVar3 + 0x80,7);
  }
  lVar27 = 0x80;
  do {
    if (*(int *)(lVar3 + lVar27) == 6) goto LAB_00568d40;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x198);
  lVar27 = 0x198;
LAB_00568d40:
  if (3 < *(ulong *)(lVar3 + 0x20 + lVar27)) {
    pQVar29 = (QFont *)(lVar3 + lVar27 + 8);
    cVar16 = ::QVariant::isNull();
    if (cVar16 == '\0') {
      lVar27 = lVar27 + lVar3;
      local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QFont>::metaType;
      uVar21 = *(ulong *)(lVar27 + 0x20) & 0xfffffffffffffffc;
      local_78.d._0_4_ = (undefined4)uVar21;
      local_78.d._4_2_ = (undefined2)(uVar21 >> 0x20);
      local_78.d._6_2_ = (undefined2)(uVar21 >> 0x30);
      bVar17 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
      if (bVar17) {
        if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
          pQVar29 = (QFont *)((long)*(int *)(*(long *)pQVar29 + 4) + *(long *)pQVar29);
        }
        QFont::QFont((QFont *)&local_78,pQVar29);
      }
      else {
        local_78.d._0_4_ = 0xaaaaaaaa;
        local_78.d._4_2_ = 0xaaaa;
        local_78.d._6_2_ = 0xaaaa;
        uStack_70 = 0xaaaaaaaa;
        uStack_6c = 0xaaaa;
        uStack_6a = 0xaaaa;
        QFont::QFont((QFont *)&local_78);
        QVar22.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
          pQVar29 = (QFont *)((long)*(int *)(*(long *)pQVar29 + 4) + *(long *)pQVar29);
        }
        QMetaType::convert(QVar22,pQVar29,(QMetaType)local_58._0_8_,&local_78);
      }
      QFont::resolve((QFont *)local_58);
      pQVar5 = *(QMetaTypeInterface **)&option->font;
      *(undefined8 *)&option->font = local_58._0_8_;
      uVar2 = *(undefined4 *)&option->field_0x60;
      *(undefined4 *)&option->field_0x60 = local_58._8_4_;
      local_58._8_4_ = uVar2;
      local_58._0_8_ = pQVar5;
      QFont::~QFont((QFont *)local_58);
      QFont::~QFont((QFont *)&local_78);
      QFontMetrics::QFontMetrics((QFontMetrics *)local_58,&option->font);
      pIVar6 = *(InterfaceType **)&(option->super_QStyleOption).fontMetrics;
      *(undefined8 *)&(option->super_QStyleOption).fontMetrics = local_58._0_8_;
      local_58._0_8_ = pIVar6;
      QFontMetrics::~QFontMetrics((QFontMetrics *)local_58);
    }
  }
  lVar27 = 0x80;
  do {
    if (*(int *)(lVar3 + lVar27) == 7) goto LAB_00568e87;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x198);
  lVar27 = 0x198;
LAB_00568e87:
  if (3 < *(ulong *)(lVar3 + 0x20 + lVar27)) {
    cVar16 = ::QVariant::isNull();
    if (cVar16 == '\0') {
      QVar18 = QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>
                         ((QVariant *)(lVar3 + lVar27 + 8));
      (option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (Int)QVar18.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                super_QFlagsStorage<Qt::AlignmentFlag>.i;
    }
  }
  lVar27 = 0x80;
  do {
    if (*(int *)(lVar3 + lVar27) == 9) goto LAB_00568ece;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x198);
  lVar27 = 0x198;
LAB_00568ece:
  cVar16 = QMetaType::canConvert
                     ((QMetaTypeInterface *)(*(ulong *)(lVar3 + 0x20 + lVar27) & 0xfffffffffffffffc)
                      ,(QMetaType)0x7f9f28);
  if (cVar16 != '\0') {
    lVar1 = lVar3 + lVar27;
    pQVar28 = (QBrush *)(lVar3 + lVar27 + 8);
    local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
    uVar21 = *(ulong *)(lVar1 + 0x20) & 0xfffffffffffffffc;
    local_78.d._0_4_ = (undefined4)uVar21;
    local_78.d._4_2_ = (undefined2)(uVar21 >> 0x20);
    local_78.d._6_2_ = (undefined2)(uVar21 >> 0x30);
    bVar17 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
    if (bVar17) {
      if ((*(byte *)(lVar1 + 0x20) & 1) != 0) {
        pQVar28 = (QBrush *)((long)*(int *)(*(long *)pQVar28 + 4) + *(long *)pQVar28);
      }
      QBrush::QBrush((QBrush *)&local_78,pQVar28);
    }
    else {
      local_78.d._0_4_ = 0xaaaaaaaa;
      local_78.d._4_2_ = 0xaaaa;
      local_78.d._6_2_ = 0xaaaa;
      QBrush::QBrush((QBrush *)&local_78);
      QVar22.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar1 + 0x20) & 1) != 0) {
        pQVar28 = (QBrush *)((long)*(int *)(*(long *)pQVar28 + 4) + *(long *)pQVar28);
      }
      QMetaType::convert(QVar22,pQVar28,(QMetaType)local_58._0_8_,&local_78);
    }
    QPalette::setBrush((int)option + 0x28,Mid,(QBrush *)0x6);
    QBrush::~QBrush((QBrush *)&local_78);
  }
  lVar27 = 0x80;
  do {
    if (*(int *)(lVar3 + lVar27) == 10) goto LAB_00568fc3;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x198);
  lVar27 = 0x198;
LAB_00568fc3:
  if (3 < *(ulong *)(lVar3 + 0x20 + lVar27)) {
    cVar16 = ::QVariant::isNull();
    if (cVar16 == '\0') {
      *(byte *)&(option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
           (byte)(option->features).
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 4;
      CVar19 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>
                         ((QVariant *)(lVar3 + lVar27 + 8));
      option->checkState = CVar19;
    }
  }
  lVar27 = 0x80;
  do {
    if (*(int *)(lVar3 + lVar27) == 1) goto LAB_00569011;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x198);
  lVar27 = 0x198;
LAB_00569011:
  if (*(ulong *)(lVar3 + 0x20 + lVar27) < 4) goto switchD_00569060_caseD_1002;
  this_00 = (QPixmap *)(lVar3 + lVar27 + 8);
  cVar16 = ::QVariant::isNull();
  if (cVar16 != '\0') goto switchD_00569060_caseD_1002;
  *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
            super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
       (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
             super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 0x10;
  iVar20 = ::QVariant::typeId((QVariant *)this_00);
  if (5 < iVar20 - 0x1001U) goto switchD_00569060_caseD_1002;
  lVar27 = lVar27 + lVar3;
  switch(iVar20) {
  case 0x1001:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d._0_4_ = 0x7f5fe0;
    local_78.d._4_2_ = 0;
    local_78.d._6_2_ = 0;
    local_80.d = (QIconPrivate *)(*(ulong *)(lVar27 + 0x20) & 0xfffffffffffffffc);
    bVar17 = comparesEqual((QMetaType *)&local_80,(QMetaType *)&local_78);
    if (bVar17) {
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QPixmap::QPixmap((QPixmap *)local_58,this_00);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)local_58);
      QVar22.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QVar13.d_ptr._4_2_ = local_78.d._4_2_;
      QVar13.d_ptr._0_4_ = local_78.d._0_4_;
      QVar13.d_ptr._6_2_ = local_78.d._6_2_;
      QMetaType::convert(QVar22,this_00,QVar13,local_58);
    }
    QIcon::QIcon(&local_80,(QPixmap *)local_58);
    QVar15.d = local_80.d;
    local_80.d = (QIconPrivate *)0x0;
    pQVar7 = (option->icon).d;
    (option->icon).d = QVar15.d;
    local_78.d._0_4_ = SUB84(pQVar7,0);
    local_78.d._4_2_ = (undefined2)((ulong)pQVar7 >> 0x20);
    local_78.d._6_2_ = (undefined2)((ulong)pQVar7 >> 0x30);
    QIcon::~QIcon(&local_78);
    QIcon::~QIcon(&local_80);
    dVar30 = (double)QPixmap::deviceIndependentSize();
    auVar31._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar31._8_8_ = (double)((ulong)dVar30 & 0x8000000000000000 | 0x3fe0000000000000) + dVar30;
    auVar34 = minpd(_DAT_0066f5d0,auVar31);
    auVar32._8_8_ = -(ulong)(-2147483648.0 < auVar34._8_8_);
    auVar32._0_8_ = -(ulong)(-2147483648.0 < auVar34._0_8_);
    uVar25 = movmskpd(extraout_EDX,auVar32);
    uVar21 = 0x8000000000000000;
    if ((uVar25 & 1) != 0) {
      uVar21 = (ulong)(uint)(int)auVar34._0_8_ << 0x20;
    }
    uVar23 = 0x80000000;
    if ((uVar25 & 2) != 0) {
      uVar23 = (ulong)(uint)(int)auVar34._8_8_;
    }
    option->decorationSize = (QSize)(uVar23 | uVar21);
    goto LAB_005694c7;
  case 0x1003:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)local_58,&option->decorationSize);
    local_80.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QColor>::metaType;
    uVar21 = *(ulong *)(lVar27 + 0x20) & 0xfffffffffffffffc;
    local_78.d._0_4_ = (undefined4)uVar21;
    local_78.d._4_2_ = (undefined2)(uVar21 >> 0x20);
    local_78.d._6_2_ = (undefined2)(uVar21 >> 0x30);
    bVar17 = comparesEqual((QMetaType *)&local_78,(QMetaType *)&local_80);
    if (bVar17) {
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      uVar10 = *(undefined8 *)this_00;
      uVar12 = *(undefined8 *)(this_00 + 8);
      local_78.d._0_4_ = (undefined4)uVar10;
      local_78.d._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
      local_78.d._6_2_ = (undefined2)((ulong)uVar10 >> 0x30);
      uStack_70 = (undefined4)uVar12;
      uStack_6c = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_6a = (undefined2)((ulong)uVar12 >> 0x30);
    }
    else {
      uStack_6a = 0xaaaa;
      local_78.d._0_4_ = 0;
      local_78.d._4_2_ = 0xffff;
      local_78.d._6_2_ = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      QVar22.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QMetaType::convert(QVar22,this_00,(QMetaType)local_80.d,&local_78);
    }
    QPixmap::fill((QColor *)local_58);
    QIcon::QIcon(&local_80,(QPixmap *)local_58);
    QVar15.d = local_80.d;
    local_80.d = (QIconPrivate *)0x0;
    pQVar7 = (option->icon).d;
    (option->icon).d = QVar15.d;
    local_78.d._0_4_ = SUB84(pQVar7,0);
    local_78.d._4_2_ = (undefined2)((ulong)pQVar7 >> 0x20);
    local_78.d._6_2_ = (undefined2)((ulong)pQVar7 >> 0x30);
    QIcon::~QIcon(&local_78);
    QIcon::~QIcon(&local_80);
LAB_005694c7:
    QPixmap::~QPixmap((QPixmap *)local_58);
    break;
  case 0x1005:
    local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    uVar21 = *(ulong *)(lVar27 + 0x20) & 0xfffffffffffffffc;
    local_78.d._0_4_ = (undefined4)uVar21;
    local_78.d._4_2_ = (undefined2)(uVar21 >> 0x20);
    local_78.d._6_2_ = (undefined2)(uVar21 >> 0x30);
    bVar17 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
    if (bVar17) {
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QIcon::QIcon(&local_78,(QIcon *)this_00);
    }
    else {
      local_78.d._0_4_ = 0xaaaaaaaa;
      local_78.d._4_2_ = 0xaaaa;
      local_78.d._6_2_ = 0xaaaa;
      QIcon::QIcon(&local_78);
      QVar22.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QMetaType::convert(QVar22,this_00,(QMetaType)local_58._0_8_,&local_78);
    }
    pQVar7 = (QIconPrivate *)CONCAT26(local_78.d._6_2_,CONCAT24(local_78.d._4_2_,local_78.d._0_4_));
    local_78.d._0_4_ = 0;
    local_78.d._4_2_ = 0;
    local_78.d._6_2_ = 0;
    local_58._0_8_ = (option->icon).d;
    (option->icon).d = pQVar7;
    QIcon::~QIcon((QIcon *)local_58);
    QIcon::~QIcon(&local_78);
    cVar16 = QIcon::isNull();
    if (cVar16 == '\0') {
      uVar25 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i;
      SVar24 = Off;
      if ((uVar25 & 1) != 0) {
        SVar24 = (uint)(int)(short)uVar25 >> 0xf & 3;
      }
      uVar21 = QIcon::actualSize((QSize *)&option->icon,(int)option + 0x50,SVar24);
      uVar23 = uVar21 >> 0x20;
      uVar25 = (option->decorationSize).wd.m_i;
      uVar26 = (ulong)uVar25;
      if ((int)uVar21 <= (int)uVar25) {
        uVar26 = uVar21 & 0xffffffff;
      }
      uVar25 = (option->decorationSize).ht.m_i;
      if ((int)uVar25 < (int)(uVar21 >> 0x20)) {
        uVar23 = (ulong)uVar25;
      }
      option->decorationSize = (QSize)(uVar26 | uVar23 << 0x20);
    }
    else {
      *(byte *)&(option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
           (byte)(option->features).
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xef;
    }
    break;
  case 0x1006:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d._0_4_ = 0x81a0b0;
    local_78.d._4_2_ = 0;
    local_78.d._6_2_ = 0;
    local_80.d = (QIconPrivate *)(*(ulong *)(lVar27 + 0x20) & 0xfffffffffffffffc);
    bVar17 = comparesEqual((QMetaType *)&local_80,(QMetaType *)&local_78);
    if (bVar17) {
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QImage::QImage((QImage *)local_58,(QImage *)this_00);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_58);
      QVar22.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar27 + 0x20) & 1) != 0) {
        this_00 = (QPixmap *)((long)*(int *)(*(long *)this_00 + 4) + *(long *)this_00);
      }
      QVar14.d_ptr._4_2_ = local_78.d._4_2_;
      QVar14.d_ptr._0_4_ = local_78.d._0_4_;
      QVar14.d_ptr._6_2_ = local_78.d._6_2_;
      QMetaType::convert(QVar22,this_00,QVar14,local_58);
    }
    QPixmap::fromImage((QPixmap *)&local_78,(QImage *)local_58,0);
    QIcon::QIcon(&local_88,(QPixmap *)&local_78);
    QVar15.d = local_88.d;
    local_88.d = (QIconPrivate *)0x0;
    local_80.d = (option->icon).d;
    (option->icon).d = QVar15.d;
    QIcon::~QIcon(&local_80);
    QIcon::~QIcon(&local_88);
    QPixmap::~QPixmap((QPixmap *)&local_78);
    dVar30 = (double)QImage::deviceIndependentSize();
    auVar34._0_8_ =
         (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa_00;
    auVar34._8_8_ = (double)((ulong)dVar30 & 0x8000000000000000 | 0x3fe0000000000000) + dVar30;
    auVar34 = minpd(_DAT_0066f5d0,auVar34);
    auVar33._8_8_ = -(ulong)(-2147483648.0 < auVar34._8_8_);
    auVar33._0_8_ = -(ulong)(-2147483648.0 < auVar34._0_8_);
    uVar25 = movmskpd(extraout_EDX_00,auVar33);
    uVar21 = 0x8000000000000000;
    if ((uVar25 & 1) != 0) {
      uVar21 = (ulong)(uint)(int)auVar34._0_8_ << 0x20;
    }
    uVar23 = 0x80000000;
    if ((uVar25 & 2) != 0) {
      uVar23 = (ulong)(uint)(int)auVar34._8_8_;
    }
    option->decorationSize = (QSize)(uVar23 | uVar21);
    QImage::~QImage((QImage *)local_58);
  }
switchD_00569060_caseD_1002:
  lVar27 = 0x80;
  do {
    if (*(int *)(lVar3 + lVar27) == 0) goto LAB_00569615;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x198);
  lVar27 = 0x198;
LAB_00569615:
  if (3 < *(ulong *)(lVar3 + 0x20 + lVar27)) {
    cVar16 = ::QVariant::isNull();
    if (cVar16 == '\0') {
      *(byte *)&(option->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
           (byte)(option->features).
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i | 8;
      (**(code **)(*(long *)this + 0xb0))(local_58,this,lVar3 + lVar27 + 8,&option->locale);
      pQVar5 = (QMetaTypeInterface *)(option->text).d.d;
      pcVar8 = (option->text).d.ptr;
      (option->text).d.d = (Data *)local_58._0_8_;
      (option->text).d.ptr = (char16_t *)local_58._8_8_;
      puVar9 = (undefined1 *)(option->text).d.size;
      (option->text).d.size = (qsizetype)local_48;
      local_58._8_8_ = pcVar8;
      local_48 = puVar9;
      if (pQVar5 != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)pQVar5 = *(int *)pQVar5 + -1;
        iVar20._0_2_ = pQVar5->revision;
        iVar20._2_2_ = pQVar5->alignment;
        UNLOCK();
        if (iVar20 == 0) {
          local_58._0_8_ = pQVar5;
          QArrayData::deallocate((QArrayData *)pQVar5,2,0x10);
        }
      }
    }
  }
  lVar27 = 0x80;
  do {
    if (*(int *)(lVar3 + lVar27) == 8) goto LAB_005696cb;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x198);
  lVar27 = 0x198;
LAB_005696cb:
  pQVar28 = (QBrush *)(lVar3 + lVar27 + 8);
  local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
  uVar21 = *(ulong *)(lVar3 + lVar27 + 0x20) & 0xfffffffffffffffc;
  local_78.d._0_4_ = (undefined4)uVar21;
  local_78.d._4_2_ = (undefined2)(uVar21 >> 0x20);
  local_78.d._6_2_ = (undefined2)(uVar21 >> 0x30);
  bVar17 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_58);
  if (bVar17) {
    if ((*(byte *)(lVar3 + lVar27 + 0x20) & 1) != 0) {
      pQVar28 = (QBrush *)((long)*(int *)(*(long *)pQVar28 + 4) + *(long *)pQVar28);
    }
    QBrush::QBrush((QBrush *)&local_78,pQVar28);
  }
  else {
    local_78.d._0_4_ = 0xaaaaaaaa;
    local_78.d._4_2_ = 0xaaaa;
    local_78.d._6_2_ = 0xaaaa;
    QBrush::QBrush((QBrush *)&local_78);
    QVar22.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((*(byte *)(lVar3 + lVar27 + 0x20) & 1) != 0) {
      pQVar28 = (QBrush *)((long)*(int *)(*(long *)pQVar28 + 4) + *(long *)pQVar28);
    }
    QMetaType::convert(QVar22,pQVar28,(QMetaType)local_58._0_8_,&local_78);
  }
  uVar10 = *(undefined8 *)&option->backgroundBrush;
  *(ulong *)&option->backgroundBrush =
       CONCAT26(local_78.d._6_2_,CONCAT24(local_78.d._4_2_,local_78.d._0_4_));
  local_78.d._0_4_ = (undefined4)uVar10;
  local_78.d._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
  local_78.d._6_2_ = (undefined2)((ulong)uVar10 >> 0x30);
  QBrush::~QBrush((QBrush *)&local_78);
  (option->super_QStyleOption).styleObject = (QObject *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::initStyleOption(QStyleOptionViewItem *option,
                                         const QModelIndex &index) const
{
    option->index = index;

    Q_D(const QStyledItemDelegate);
    QModelRoleDataSpan modelRoleDataSpan = d->modelRoleData;
    index.multiData(modelRoleDataSpan);

    const QVariant *value;
    value = modelRoleDataSpan.dataForRole(Qt::FontRole);
    if (value->isValid() && !value->isNull()) {
        option->font = qvariant_cast<QFont>(*value).resolve(option->font);
        option->fontMetrics = QFontMetrics(option->font);
    }

    value = modelRoleDataSpan.dataForRole(Qt::TextAlignmentRole);
    if (value->isValid() && !value->isNull())
        option->displayAlignment = QtPrivate::legacyFlagValueFromModelData<Qt::Alignment>(*value);

    value = modelRoleDataSpan.dataForRole(Qt::ForegroundRole);
    if (value->canConvert<QBrush>())
        option->palette.setBrush(QPalette::Text, qvariant_cast<QBrush>(*value));

    value = modelRoleDataSpan.dataForRole(Qt::CheckStateRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasCheckIndicator;
        option->checkState = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(*value);
    }

    value = modelRoleDataSpan.dataForRole(Qt::DecorationRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDecoration;
        switch (value->userType()) {
        case QMetaType::QIcon: {
            option->icon = qvariant_cast<QIcon>(*value);
            if (option->icon.isNull()) {
                option->features &= ~QStyleOptionViewItem::HasDecoration;
                break;
            }
            QIcon::Mode mode;
            if (!(option->state & QStyle::State_Enabled))
                mode = QIcon::Disabled;
            else if (option->state & QStyle::State_Selected)
                mode = QIcon::Selected;
            else
                mode = QIcon::Normal;
            QIcon::State state = option->state & QStyle::State_Open ? QIcon::On : QIcon::Off;
            QSize actualSize = option->icon.actualSize(option->decorationSize, mode, state);
            // For highdpi icons actualSize might be larger than decorationSize, which we don't want. Clamp it to decorationSize.
            option->decorationSize = QSize(qMin(option->decorationSize.width(), actualSize.width()),
                                           qMin(option->decorationSize.height(), actualSize.height()));
            break;
        }
        case QMetaType::QColor: {
            QPixmap pixmap(option->decorationSize);
            pixmap.fill(qvariant_cast<QColor>(*value));
            option->icon = QIcon(pixmap);
            break;
        }
        case QMetaType::QImage: {
            QImage image = qvariant_cast<QImage>(*value);
            option->icon = QIcon(QPixmap::fromImage(image));
            option->decorationSize = image.deviceIndependentSize().toSize();
            break;
        }
        case QMetaType::QPixmap: {
            QPixmap pixmap = qvariant_cast<QPixmap>(*value);
            option->icon = QIcon(pixmap);
            option->decorationSize = pixmap.deviceIndependentSize().toSize();
            break;
        }
        default:
            break;
        }
    }

    value = modelRoleDataSpan.dataForRole(Qt::DisplayRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDisplay;
        option->text = displayText(*value, option->locale);
    }

    value = modelRoleDataSpan.dataForRole(Qt::BackgroundRole);
    option->backgroundBrush = qvariant_cast<QBrush>(*value);

    // disable style animations for checkboxes etc. within itemviews (QTBUG-30146)
    option->styleObject = nullptr;
}